

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O1

mutable_buffers_type __thiscall
io::net::dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_>::prepare
          (dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *this,size_t n)

{
  pointer puVar1;
  pointer puVar2;
  length_error *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_type __new_size;
  mutable_buffers_type mVar6;
  
  __new_size = this->size_ + n;
  if (__new_size <= this->max_size_) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this->vec_,__new_size);
    puVar1 = (this->vec_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = (long)(this->vec_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    puVar2 = (pointer)0x0;
    if (uVar4 != 0) {
      puVar2 = puVar1;
    }
    uVar3 = this->size_;
    if (uVar4 < this->size_) {
      uVar3 = uVar4;
    }
    mVar6.data_ = puVar2 + uVar3;
    uVar5 = uVar4 - uVar3;
    if (n <= uVar4 - uVar3) {
      uVar5 = n;
    }
    mVar6.size_ = uVar5;
    return mVar6;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_00,"dynamic_vector_buffer::prepare(): size() + n > max_size()");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

mutable_buffers_type prepare(std::size_t n)
    {
        if (size_ + n > max_size_) {
            throw std::length_error{"dynamic_vector_buffer::prepare(): size() + n > max_size()"};
        }

        vec_.resize(size_ + n);
        return buffer(buffer(vec_) + size_, n);
    }